

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

bool anon_unknown.dwarf_1519a::CheckConsume(ParseContext *ctx,LexemeType type,char *msg,...)

{
  LexemeType LVar1;
  char in_AL;
  undefined8 in_RCX;
  char *pos;
  Lexeme *begin;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  LVar1 = ctx->currentLexeme->type;
  if (LVar1 != lex_none && LVar1 == type) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  if (LVar1 != type) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &args[0].overflow_arg_area;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    begin = ctx->currentLexeme;
    if ((begin == ctx->lastLexeme) && (begin != ctx->firstLexeme)) {
      pos = begin[-1].pos + begin[-1].length;
      begin = begin + -1;
    }
    else {
      pos = begin->pos;
    }
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    ReportAt(ctx,begin,begin,pos,msg,&local_e8);
  }
  return LVar1 == type;
}

Assistant:

bool CheckConsume(ParseContext &ctx, LexemeType type, const char *msg, ...)
	{
		if(!ctx.Consume(type))
		{
			va_list args;
			va_start(args, msg);

			Lexeme *curr = ctx.Current();

			if(curr == ctx.Last() && curr != ctx.First())
				ReportAt(ctx, curr - 1, curr - 1, (curr - 1)->pos + (curr - 1)->length, msg, args);
			else
				ReportAt(ctx, curr, curr, curr->pos, msg, args);

			va_end(args);

			return false;
		}

		return true;
	}